

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.cc
# Opt level: O0

matrix4d *
tinyusdz::GetLocalTransform
          (matrix4d *__return_storage_ptr__,Prim *prim,bool *resetXformStack,double t,
          TimeSampleInterpolationType tinterp)

{
  bool bVar1;
  value_type *__src;
  undefined1 local_140 [8];
  expected<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ret;
  undefined1 local_b0 [7];
  bool rxs;
  matrix4d m;
  Xformable *xformable;
  TimeSampleInterpolationType tinterp_local;
  double t_local;
  bool *resetXformStack_local;
  Prim *prim_local;
  
  bVar1 = IsXformablePrim(prim);
  if (!bVar1) {
    if (resetXformStack != (bool *)0x0) {
      *resetXformStack = false;
    }
    value::matrix4d::identity();
    return __return_storage_ptr__;
  }
  if (resetXformStack != (bool *)0x0) {
    *resetXformStack = false;
  }
  m.m[3][3] = 0.0;
  bVar1 = CastToXformable(prim,(Xformable **)(m.m[3] + 3));
  if (bVar1) {
    if (m.m[3][3] == 0.0) {
      value::matrix4d::identity();
      return __return_storage_ptr__;
    }
    value::matrix4d::matrix4d((matrix4d *)local_b0);
    ret.contained.
    super_storage_t_impl<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._135_1_ = 0;
    Xformable::GetLocalMatrix_abi_cxx11_
              ((expected<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_140,(Xformable *)m.m[3][3],t,tinterp,
               (bool *)&ret.contained.
                        super_storage_t_impl<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        .field_0x87);
    bVar1 = nonstd::expected_lite::expected::operator_cast_to_bool((expected *)local_140);
    if (bVar1) {
      if (resetXformStack != (bool *)0x0) {
        *resetXformStack =
             (bool)(ret.contained.
                    super_storage_t_impl<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ._135_1_ & 1);
      }
      __src = nonstd::expected_lite::
              expected<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::value((expected<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)local_140);
      memcpy(__return_storage_ptr__,__src,0x80);
      bVar1 = true;
    }
    else {
      bVar1 = false;
    }
    nonstd::expected_lite::
    expected<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~expected((expected<tinyusdz::value::matrix4d,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_140);
    if (bVar1) {
      return __return_storage_ptr__;
    }
  }
  value::matrix4d::identity();
  return __return_storage_ptr__;
}

Assistant:

value::matrix4d GetLocalTransform(const Prim &prim, bool *resetXformStack,
                                  double t,
                                  value::TimeSampleInterpolationType tinterp) {
  if (!IsXformablePrim(prim)) {
    if (resetXformStack) {
      (*resetXformStack) = false;
    }
    return value::matrix4d::identity();
  }

  // default false
  if (resetXformStack) {
    (*resetXformStack) = false;
  }

  const Xformable *xformable{nullptr};
  if (CastToXformable(prim, &xformable)) {
    if (!xformable) {
      return value::matrix4d::identity();
    }

    value::matrix4d m;
    bool rxs{false};
    nonstd::expected<value::matrix4d, std::string> ret =
        xformable->GetLocalMatrix(t, tinterp, &rxs);
    if (ret) {
      if (resetXformStack) {
        (*resetXformStack) = rxs;
      }
      return ret.value();
    }
  }

  return value::matrix4d::identity();
}